

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finder.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
::line_start_finder(line_start_finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_1UL>
                    *this,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  char_class_type cVar1;
  int iVar2;
  cpp_regex_traits<char> *in_RSI;
  char (*in_RDI) [8];
  int j;
  char_class_type newline;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined6 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd6;
  int local_28;
  
  finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::finder((finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  *in_RDI = (char  [8])&PTR__line_start_finder_0021db70;
  cVar1 = lookup_classname<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,8ul>
                    ((regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                     CONCAT26(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0),in_RDI,
                     (bool)in_stack_ffffffffffffffc7);
  for (local_28 = 0; local_28 < 0x100; local_28 = local_28 + 1) {
    iVar2 = cpp_regex_traits<char>::isctype(in_RSI,(int)(char)local_28,(uint)cVar1);
    in_RDI[1][(long)local_28 + 4] = (byte)iVar2 & 1;
  }
  return;
}

Assistant:

line_start_finder(Traits const &tr)
    {
        char_class_type newline = lookup_classname(tr, "newline");
        for(int j = 0; j < 256; ++j)
        {
            this->bits_[j] = tr.isctype(static_cast<char_type>(static_cast<unsigned char>(j)), newline);
        }
    }